

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grammar.cpp
# Opt level: O0

bool Grammar::is_float_value(string *str)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  char *pcVar4;
  ulong in_RDI;
  bool bVar5;
  int i;
  int count_numeric;
  int count_point;
  bool local_69;
  string *str_00;
  bool local_5d;
  string local_40 [36];
  uint local_1c;
  int local_18;
  int local_14;
  ulong local_10;
  bool local_1;
  
  local_10 = in_RDI;
  lVar3 = std::__cxx11::string::size();
  if (lVar3 == 0) {
    local_1 = false;
  }
  else {
    local_14 = 0;
    local_18 = 0;
    pcVar4 = (char *)std::__cxx11::string::operator[](local_10);
    bVar5 = true;
    if (*pcVar4 != '+') {
      pcVar4 = (char *)std::__cxx11::string::operator[](local_10);
      bVar5 = *pcVar4 == '-';
    }
    for (local_1c = (uint)bVar5; uVar1 = local_1c, iVar2 = std::__cxx11::string::size(),
        (int)uVar1 < iVar2; local_1c = local_1c + 1) {
      pcVar4 = (char *)std::__cxx11::string::operator[](local_10);
      bVar5 = str_utils::is_numeric(*pcVar4);
      if ((!bVar5) && (pcVar4 = (char *)std::__cxx11::string::operator[](local_10), *pcVar4 != '.'))
      {
        pcVar4 = (char *)std::__cxx11::string::operator[](local_10);
        if (*pcVar4 == 'e') {
          bVar5 = false;
          local_5d = false;
          if ((local_14 < 2) && (local_5d = false, 0 < local_18)) {
            str_00 = local_40;
            std::__cxx11::string::substr((ulong)str_00,local_10);
            bVar5 = true;
            local_5d = is_integer_value(str_00);
          }
          local_1 = local_5d;
          if (bVar5) {
            std::__cxx11::string::~string((string *)local_40);
          }
        }
        else {
          local_1 = false;
        }
        goto LAB_001b08b6;
      }
      pcVar4 = (char *)std::__cxx11::string::operator[](local_10);
      if (*pcVar4 == '.') {
        local_14 = local_14 + 1;
      }
      pcVar4 = (char *)std::__cxx11::string::operator[](local_10);
      bVar5 = str_utils::is_numeric(*pcVar4);
      if (bVar5) {
        local_18 = local_18 + 1;
      }
    }
    local_69 = local_14 < 2 && 0 < local_18;
    local_1 = local_69;
  }
LAB_001b08b6:
  return (bool)(local_1 & 1);
}

Assistant:

bool Grammar::is_float_value(const std::string& str) {
    if (str.size() == 0)
        return false;
    int count_point = 0, count_numeric = 0;
    for (int i = (str[0] == '+' || str[0] == '-') ? 1 : 0; i < int(str.size()); i++) {
        if (!str_utils::is_numeric(str[i]) && str[i] != '.') {
            if (str[i] != 'e')
                return false;
            return count_point <= 1 && count_numeric > 0 && is_integer_value(str.substr(i + 1));
        }
        if (str[i] == '.')
            count_point++;
        if (str_utils::is_numeric(str[i]))
            count_numeric++;
    }
    return count_point <= 1 && count_numeric > 0;
}